

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionChannel::pipelineInto
          (QHttpNetworkConnectionChannel *this,HttpMessagePair *pair)

{
  long lVar1;
  QHttpNetworkRequestPrivate *pQVar2;
  QHttpNetworkReplyPrivate *pQVar3;
  undefined8 in_RSI;
  QHttpNetworkRequest *in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkReply *reply;
  QHttpNetworkRequest *request;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar4;
  undefined1 throughProxy;
  QHttpNetworkRequest *request_00;
  
  throughProxy = (undefined1)((ulong)in_RSI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  request_00 = in_RDI;
  QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2fb3eb);
  QHttpNetworkReplyPrivate::clear
            ((QHttpNetworkReplyPrivate *)
             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2fb40d);
  QPointer<QHttpNetworkConnection>::operator=
            ((QPointer<QHttpNetworkConnection> *)
             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (QPointer<QHttpNetworkConnection> *)in_stack_ffffffffffffff88);
  QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2fb42b);
  QPointer<QHttpNetworkConnectionChannel>::operator=
            ((QPointer<QHttpNetworkConnectionChannel> *)
             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
            );
  pQVar2 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                     ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)
                      CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  bVar4 = pQVar2->autoDecompress;
  pQVar3 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2fb461);
  pQVar3->autoDecompress = (bool)(bVar4 & 1);
  pQVar3 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2fb478);
  pQVar3->pipeliningUsed = true;
  QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb4a6);
  QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb4ae);
  QNetworkProxy::type((QNetworkProxy *)CONCAT17(bVar4,in_stack_ffffffffffffff90));
  QHttpNetworkRequestPrivate::header(request_00,(bool)throughProxy);
  QByteArray::append((QByteArray *)(in_RDI + 0xd));
  QByteArray::~QByteArray((QByteArray *)0x2fb4f3);
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::append
            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             CONCAT17(bVar4,in_stack_ffffffffffffff90),(parameter_type)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::pipelineInto(HttpMessagePair &pair)
{
    // this is only called for simple GET

    QHttpNetworkRequest &request = pair.first;
    QHttpNetworkReply *reply = pair.second;
    reply->d_func()->clear();
    reply->d_func()->connection = connection;
    reply->d_func()->connectionChannel = this;
    reply->d_func()->autoDecompress = request.d->autoDecompress;
    reply->d_func()->pipeliningUsed = true;

#ifndef QT_NO_NETWORKPROXY
    pipeline.append(QHttpNetworkRequestPrivate::header(request,
                                                           (connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy)));
#else
    pipeline.append(QHttpNetworkRequestPrivate::header(request, false));
#endif

    alreadyPipelinedRequests.append(pair);

    // pipelineFlush() needs to be called at some point afterwards
}